

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-random.c
# Opt level: O2

void random_cb(uv_random_t *req,int status,void *buf,size_t buflen)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uStack_120;
  char zero [256];
  
  memset(zero,0,0x100);
  iVar1 = random_cb_called;
  if (status == 0) {
    if ((char *)buf == scratch) {
      if (random_cb_called == 0) {
        if (buflen == 0) {
          iVar2 = bcmp(scratch,zero,0x100);
          if (iVar2 == 0) goto LAB_00146255;
          pcVar3 = "0 == memcmp(scratch, zero, sizeof(zero))";
          uStack_120 = 0x29;
        }
        else {
          pcVar3 = "buflen == 0";
          uStack_120 = 0x28;
        }
      }
      else if (buflen == 0x100) {
        iVar2 = bcmp(scratch,zero,0x100);
        if (iVar2 != 0) {
LAB_00146255:
          random_cb_called = iVar1 + 1;
          return;
        }
        pcVar3 = "0 != memcmp(scratch, zero, sizeof(zero))";
        uStack_120 = 0x2d;
      }
      else {
        pcVar3 = "buflen == sizeof(scratch)";
        uStack_120 = 0x2b;
      }
    }
    else {
      pcVar3 = "buf == (void*) scratch";
      uStack_120 = 0x25;
    }
  }
  else {
    pcVar3 = "0 == status";
    uStack_120 = 0x24;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-random.c"
          ,uStack_120,pcVar3);
  abort();
}

Assistant:

static void random_cb(uv_random_t* req, int status, void* buf, size_t buflen) {
  char zero[sizeof(scratch)];

  memset(zero, 0, sizeof(zero));

  ASSERT(0 == status);
  ASSERT(buf == (void*) scratch);

  if (random_cb_called == 0) {
    ASSERT(buflen == 0);
    ASSERT(0 == memcmp(scratch, zero, sizeof(zero)));
  } else {
    ASSERT(buflen == sizeof(scratch));
    /* Buy a lottery ticket if you manage to trip this assertion. */
    ASSERT(0 != memcmp(scratch, zero, sizeof(zero)));
  }

  random_cb_called++;
}